

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O3

void __thiscall mraa::Iio::Iio(Iio *this,string *deviceName)

{
  int iVar1;
  mraa_iio_context p_Var2;
  ostream *poVar3;
  invalid_argument *piVar4;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  iVar1 = mraa_iio_get_device_num_by_name((deviceName->_M_dataplus)._M_p);
  if (iVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"IIO device name ",0x10)
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(deviceName->_M_dataplus)._M_p,
                        deviceName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," not found",10);
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar4,local_1b0);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  p_Var2 = (mraa_iio_context)mraa_iio_init(iVar1);
  this->m_iio = p_Var2;
  if (p_Var2 != (mraa_iio_context)0x0) {
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"IIO device ",0xb);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(deviceName->_M_dataplus)._M_p,
                      deviceName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not valid",0xd);
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar4,local_1b0);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Iio(const std::string& deviceName)
    {
        std::ostringstream oss;
        int id = mraa_iio_get_device_num_by_name(deviceName.c_str());
        if (id == -1) {
            oss << "IIO device name " << deviceName << " not found";
            throw std::invalid_argument(oss.str());
        }
        m_iio = mraa_iio_init(id);
        if (m_iio == NULL) {
            oss << "IIO device " << deviceName << " is not valid";
            throw std::invalid_argument(oss.str());
        }
    }